

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_zip.c
# Opt level: O0

exr_result_t
internal_exr_undo_zip
          (exr_decode_pipeline_t *decode,void *compressed_data,uint64_t comp_buf_size,
          void *uncompressed_data,uint64_t uncompressed_size)

{
  exr_result_t eVar1;
  void *in_RCX;
  size_t *in_RDX;
  void **in_RSI;
  undefined8 in_RDI;
  size_t *in_R8;
  uint64_t scratchbufsz;
  exr_result_t rv;
  size_t *scratch_size;
  uint in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  scratch_size = in_R8;
  if (in_R8 < in_RDX) {
    scratch_size = in_RDX;
  }
  eVar1 = internal_decode_alloc_buffer
                    ((exr_decode_pipeline_t *)
                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (exr_transcoding_pipeline_buffer_id_t)((ulong)in_RDI >> 0x20),in_RSI,in_RDX,
                     (size_t)in_RCX);
  if (eVar1 == 0) {
    eVar1 = undo_zip_impl(in_RSI,(uint64_t)in_RDX,in_RCX,(uint64_t)in_R8,
                          (void *)(ulong)in_stack_ffffffffffffffc8,(uint64_t)scratch_size);
  }
  return eVar1;
}

Assistant:

exr_result_t
internal_exr_undo_zip (
    exr_decode_pipeline_t* decode,
    const void*            compressed_data,
    uint64_t               comp_buf_size,
    void*                  uncompressed_data,
    uint64_t               uncompressed_size)
{
    exr_result_t rv;
    uint64_t scratchbufsz = uncompressed_size;
    if ( comp_buf_size > scratchbufsz )
        scratchbufsz = comp_buf_size;

    rv = internal_decode_alloc_buffer (
        decode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(decode->scratch_buffer_1),
        &(decode->scratch_alloc_size_1),
        scratchbufsz);
    if (rv != EXR_ERR_SUCCESS) return rv;
    return undo_zip_impl (
        compressed_data,
        comp_buf_size,
        uncompressed_data,
        uncompressed_size,
        decode->scratch_buffer_1,
        decode->scratch_alloc_size_1);
}